

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

String * __thiscall
kj::HttpHeaders::serialize
          (String *__return_storage_ptr__,HttpHeaders *this,ArrayPtr<const_char> word1,
          ArrayPtr<const_char> word2,ArrayPtr<const_char> word3,
          ArrayPtr<const_kj::StringPtr> connectionHeaders)

{
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  Header *pHVar4;
  Header *header;
  Header *pHVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  ArrayPtr<const_kj::StringPtr> *pAVar9;
  unsigned_long i_1;
  size_t size;
  long lVar10;
  Iterator __begin1;
  ulong uVar11;
  StringPtr *pSVar12;
  Fault f;
  StringPtr newline;
  StringPtr colon;
  StringPtr space;
  ArrayPtr<const_char> word2_local;
  ArrayPtr<const_char> word1_local;
  StringPtr local_40;
  
  word2_local.size_ = word2.size_;
  word2_local.ptr = word2.ptr;
  sVar8 = word1.size_;
  word1_local.ptr = word1.ptr;
  space.content.ptr = " ";
  space.content.size_ = 2;
  newline.content.ptr = "\r\n";
  newline.content.size_ = 3;
  colon.content.ptr = ": ";
  colon.content.size_ = 3;
  uVar2 = (this->indexedHeaders).size_;
  word1_local.size_ = sVar8;
  if (uVar2 < connectionHeaders.size_) {
    _::Debug::Fault::Fault
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x3bc,FAILED,"connectionHeaders.size() <= indexedHeaders.size()","");
    _::Debug::Fault::fatal(&f);
  }
  size = 2;
  if (sVar8 != 0) {
    size = word3.size_ + 6 + word2_local.size_ + sVar8;
  }
  lVar10 = 8;
  for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
    pSVar12 = (this->indexedHeaders).ptr;
    if (uVar11 < connectionHeaders.size_) {
      pSVar12 = connectionHeaders.ptr;
    }
    uVar3 = *(ulong *)((long)&(pSVar12->content).ptr + lVar10);
    if (1 < uVar3) {
      size = size + uVar3 + (this->table->namesById).builder.ptr[uVar11 & 0xffffffff].content.size_
             + 2;
    }
    lVar10 = lVar10 + 0x10;
  }
  for (pHVar5 = (this->unindexedHeaders).builder.ptr; pHVar5 != (this->unindexedHeaders).builder.pos
      ; pHVar5 = pHVar5 + 1) {
    size = size + (pHVar5->name).content.size_ + (pHVar5->value).content.size_ + 2;
  }
  heapString(__return_storage_ptr__,size);
  pcVar6 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->content).ptr;
  }
  if (sVar8 != 0) {
    pcVar6 = _::
             fill<kj::ArrayPtr<char_const>,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&,kj::ArrayPtr<char_const>&,kj::StringPtr_const&>
                       (pcVar6,&word1_local,&space,&word2_local,&space,&word3,&newline);
  }
  uVar2 = (this->indexedHeaders).size_;
  lVar10 = 0;
  for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
    pAVar9 = (ArrayPtr<const_kj::StringPtr> *)&this->indexedHeaders;
    if (uVar11 < connectionHeaders.size_) {
      pAVar9 = &connectionHeaders;
    }
    puVar1 = (undefined8 *)((long)&(pAVar9->ptr->content).ptr + lVar10);
    f.exception = (Exception *)*puVar1;
    if (1 < (ulong)puVar1[1]) {
      pSVar12 = (this->table->namesById).builder.ptr + (uVar11 & 0xffffffff);
      local_40.content.ptr = (pSVar12->content).ptr;
      local_40.content.size_ = (pSVar12->content).size_;
      pcVar6 = _::fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr&,kj::StringPtr_const&>
                         (pcVar6,&local_40,&colon,(StringPtr *)&f,&newline);
    }
    lVar10 = lVar10 + 0x10;
  }
  pHVar4 = (this->unindexedHeaders).builder.pos;
  for (pHVar5 = (this->unindexedHeaders).builder.ptr; pHVar5 != pHVar4; pHVar5 = pHVar5 + 1) {
    pcVar6 = _::fill<kj::StringPtr,kj::StringPtr_const&,kj::StringPtr_const&,kj::StringPtr_const&>
                       (pcVar6,&pHVar5->name,&colon,&pHVar5->value,&newline);
  }
  pcVar7 = _::fill<kj::StringPtr>(pcVar6,&newline);
  sVar8 = (__return_storage_ptr__->content).size_;
  pcVar6 = (__return_storage_ptr__->content).ptr + (sVar8 - 1);
  if (sVar8 == 0) {
    pcVar6 = (char *)0x0;
  }
  if (pcVar7 == pcVar6) {
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x3d8,FAILED,"ptr == result.end()","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

kj::String HttpHeaders::serialize(kj::ArrayPtr<const char> word1,
                                  kj::ArrayPtr<const char> word2,
                                  kj::ArrayPtr<const char> word3,
                                  kj::ArrayPtr<const kj::StringPtr> connectionHeaders) const {
  const kj::StringPtr space = " ";
  const kj::StringPtr newline = "\r\n";
  const kj::StringPtr colon = ": ";

  size_t size = 2;  // final \r\n
  if (word1 != nullptr) {
    size += word1.size() + word2.size() + word3.size() + 4;
  }
  KJ_ASSERT(connectionHeaders.size() <= indexedHeaders.size());
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      size += table->idToString(HttpHeaderId(table, i)).size() + value.size() + 4;
    }
  }
  for (auto& header: unindexedHeaders) {
    size += header.name.size() + header.value.size() + 4;
  }

  String result = heapString(size);
  char* ptr = result.begin();

  if (word1 != nullptr) {
    ptr = kj::_::fill(ptr, word1, space, word2, space, word3, newline);
  }
  for (auto i: kj::indices(indexedHeaders)) {
    kj::StringPtr value = i < connectionHeaders.size() ? connectionHeaders[i] : indexedHeaders[i];
    if (value != nullptr) {
      ptr = kj::_::fill(ptr, table->idToString(HttpHeaderId(table, i)), colon, value, newline);
    }
  }
  for (auto& header: unindexedHeaders) {
    ptr = kj::_::fill(ptr, header.name, colon, header.value, newline);
  }
  ptr = kj::_::fill(ptr, newline);

  KJ_ASSERT(ptr == result.end());
  return result;
}